

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int dup_identities_check(char *id,lys_module *module)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  lys_module *plVar4;
  long lVar5;
  
  iVar3 = dup_identity_check(id,module->ident,(uint)module->ident_size);
  if (iVar3 == 0) {
    plVar4 = lys_main_module(module);
    bVar1 = plVar4->inc_size;
    lVar5 = 0;
    do {
      if (((ulong)bVar1 * 0x30 + 0x30 == lVar5 + 0x30) ||
         (lVar2 = *(long *)(plVar4->inc->rev + lVar5 + -8), lVar2 == 0)) {
        return 0;
      }
      iVar3 = dup_identity_check(id,*(lys_ident **)(lVar2 + 0x78),(uint)*(ushort *)(lVar2 + 0x48));
      lVar5 = lVar5 + 0x30;
    } while (iVar3 == 0);
  }
  ly_vlog(module->ctx,LYE_DUPID,LY_VLOG_NONE,(void *)0x0,"identity",id);
  return 1;
}

Assistant:

int
dup_identities_check(const char *id, struct lys_module *module)
{
    struct lys_module *mainmod;
    int i;

    if (dup_identity_check(id, module->ident, module->ident_size)) {
        LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "identity", id);
        return EXIT_FAILURE;
    }

    /* check identity in submodules */
    mainmod = lys_main_module(module);
    for (i = 0; i < mainmod->inc_size && mainmod->inc[i].submodule; ++i) {
        if (dup_identity_check(id, mainmod->inc[i].submodule->ident, mainmod->inc[i].submodule->ident_size)) {
            LOGVAL(module->ctx, LYE_DUPID, LY_VLOG_NONE, NULL, "identity", id);
            return EXIT_FAILURE;
        }
    }

    return EXIT_SUCCESS;
}